

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O3

void Cnf_AddCardinConstrRange(sat_solver *p,int *pVars,int lo,int hi,int *pnVars)

{
  int i;
  int hi_00;
  int iVar1;
  uint uVar2;
  
  uVar2 = hi - lo;
  if (uVar2 != 0 && lo <= hi) {
    hi_00 = (uVar2 >> 1) + lo;
    iVar1 = hi_00;
    if (hi_00 < lo) {
      iVar1 = lo;
    }
    i = lo;
    do {
      Cnf_AddSorder(p,pVars,i,(uVar2 + 1 >> 1) + i,pnVars);
      i = i + 1;
    } while (iVar1 + 1 != i);
    Cnf_AddCardinConstrRange(p,pVars,lo,hi_00,pnVars);
    Cnf_AddCardinConstrRange(p,pVars,hi_00 + 1,hi,pnVars);
    Cnf_AddCardinConstrMerge(p,pVars,lo,hi,1,pnVars);
    return;
  }
  return;
}

Assistant:

static inline void Cnf_AddCardinConstrRange( sat_solver * p, int * pVars, int lo, int hi, int * pnVars )
{
    if ( hi - lo >= 1 )
    {
        int i, mid = lo + (hi - lo) / 2;
        for ( i = lo; i <= mid; i++ )
            Cnf_AddSorder( p, pVars, i, i + (hi - lo + 1) / 2, pnVars );
        Cnf_AddCardinConstrRange( p, pVars, lo, mid, pnVars );
        Cnf_AddCardinConstrRange( p, pVars, mid+1, hi, pnVars );
        Cnf_AddCardinConstrMerge( p, pVars, lo, hi, 1, pnVars );
    }
}